

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::Glob(string *directory,string *regexp,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *files)

{
  bool bVar1;
  Status SVar2;
  unsigned_long uVar3;
  char *__s;
  uint uVar4;
  Directory d;
  string fname;
  RegularExpression reg;
  allocator<char> local_131;
  Directory local_130;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  RegularExpression local_100;
  
  local_128 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files;
  cmsys::Directory::Directory(&local_130);
  cmsys::RegularExpression::RegularExpression(&local_100,(regexp->_M_dataplus)._M_p);
  SVar2 = cmsys::Directory::Load(&local_130,directory,(string *)0x0);
  if (SVar2.Kind_ == Success) {
    uVar3 = cmsys::Directory::GetNumberOfFiles(&local_130);
    for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
      __s = cmsys::Directory::GetFile(&local_130,(ulong)uVar4);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,__s,&local_131);
      bVar1 = cmsys::RegularExpression::find(&local_100,local_120._M_dataplus._M_p);
      if (bVar1) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_128,&local_120);
      }
      std::__cxx11::string::~string((string *)&local_120);
    }
  }
  cmsys::RegularExpression::~RegularExpression(&local_100);
  cmsys::Directory::~Directory(&local_130);
  return;
}

Assistant:

void cmSystemTools::Glob(const std::string& directory,
                         const std::string& regexp,
                         std::vector<std::string>& files)
{
  cmsys::Directory d;
  cmsys::RegularExpression reg(regexp.c_str());

  if (d.Load(directory)) {
    size_t numf;
    unsigned int i;
    numf = d.GetNumberOfFiles();
    for (i = 0; i < numf; i++) {
      std::string fname = d.GetFile(i);
      if (reg.find(fname)) {
        files.push_back(std::move(fname));
      }
    }
  }
}